

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O1

int gzputs(gzFile file,char *s)

{
  size_t len;
  z_size_t zVar1;
  int iVar2;
  
  iVar2 = -1;
  if (((file != (gzFile)0x0) && (file[1].have == 0x79b1)) && (*(int *)((long)&file[4].pos + 4) == 0)
     ) {
    len = strlen(s);
    if ((len & 0xffffffff80000000) == 0) {
      zVar1 = gz_write((gz_statep)file,s,len);
      iVar2 = -1;
      if (len <= zVar1) {
        iVar2 = (int)len;
      }
    }
    else {
      gz_error((gz_statep)file,-2,"string length does not fit in int");
    }
  }
  return iVar2;
}

Assistant:

int ZEXPORT gzputs(gzFile file, const char *s) {
    z_size_t len, put;
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return -1;

    /* write string */
    len = strlen(s);
    if ((int)len < 0 || (unsigned)len != len) {
        gz_error(state, Z_STREAM_ERROR, "string length does not fit in int");
        return -1;
    }
    put = gz_write(state, s, len);
    return put < len ? -1 : (int)len;
}